

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runsuite.c
# Opt level: O3

int main(int argc,char **argv)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 *puVar5;
  long lVar6;
  xmlNodePtr pxVar7;
  xmlChar *pxVar8;
  xmlNodePtr cur;
  char *pcVar9;
  bool bVar10;
  
  logfile = (FILE *)fopen64("runsuite.log","w");
  if ((FILE *)logfile == (FILE *)0x0) {
    main_cold_1();
  }
  puVar5 = (undefined4 *)__xmlGetWarningsDefaultValue();
  *puVar5 = 0;
  xmlPedanticParserDefault(0);
  xmlMemSetup(xmlMemFree,xmlMemMalloc,xmlMemRealloc,xmlMemoryStrdup);
  xmlInitParser();
  xmlSetExternalEntityLoader(testExternalEntityLoader);
  ctxtXPath = (xmlXPathContextPtr_conflict)xmlXPathNewContext(0);
  if (ctxtXPath->cache != (void *)0x0) {
    xmlXPathContextSetCache(ctxtXPath,0,0xffffffff,0);
  }
  xmlXPathRegisterNs(ctxtXPath,"ts","TestSuite");
  xmlXPathRegisterNs(ctxtXPath,"xlink","http://www.w3.org/1999/xlink");
  xmlSetGenericErrorFunc(0,testErrorHandler);
  xmlSchemaInitTypes();
  xmlRelaxNGInitTypes();
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar1 = nb_errors;
  if ((((1 < argc) && (pcVar9 = argv[1], *pcVar9 == '-')) && (pcVar9[1] == 'v')) &&
     (pcVar9[2] == '\0')) {
    verbose = '\x01';
  }
  lVar6 = xmlReadFile("test/xsdtest/xsdtestsuite.xml",0,2);
  if (lVar6 == 0) {
    main_cold_3();
  }
  else {
    puts("## XML Schemas datatypes test suite from James Clark");
    pxVar7 = (xmlNodePtr)xmlDocGetRootElement(lVar6);
    if (((pxVar7 == (xmlNodePtr)0x0) || (iVar4 = xmlStrEqual(pxVar7->name,"testSuite"), iVar4 == 0))
       || ((pxVar7 = getNext(pxVar7,"./testSuite[1]"), pxVar7 == (xmlNodePtr)0x0 ||
           (iVar4 = xmlStrEqual(pxVar7->name,"testSuite"), iVar4 == 0)))) {
      main_cold_2();
    }
    else {
      do {
        xsdTestSuite(pxVar7);
        pxVar7 = getNext(pxVar7,"following-sibling::testSuite[1]");
      } while (pxVar7 != (xmlNodePtr)0x0);
    }
    xmlFreeDoc(lVar6);
  }
  if (nb_leaks == iVar3 && nb_errors == iVar1) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar3));
  }
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar1 = nb_errors;
  lVar6 = xmlReadFile("test/relaxng/OASIS/spectest.xml",0,2);
  if (lVar6 == 0) {
    main_cold_5();
  }
  else {
    puts("## Relax NG test suite from James Clark");
    pxVar7 = (xmlNodePtr)xmlDocGetRootElement(lVar6);
    if (((pxVar7 == (xmlNodePtr)0x0) || (iVar4 = xmlStrEqual(pxVar7->name,"testSuite"), iVar4 == 0))
       || ((pxVar7 = getNext(pxVar7,"./testSuite[1]"), pxVar7 == (xmlNodePtr)0x0 ||
           (iVar4 = xmlStrEqual(pxVar7->name,"testSuite"), iVar4 == 0)))) {
      main_cold_4();
    }
    else {
      do {
        if (verbose == '\x01') {
          pxVar8 = getString(pxVar7,"string(documentation)");
          if (pxVar8 == (xmlChar *)0x0) {
            pxVar8 = getString(pxVar7,"string(section)");
            if (pxVar8 == (xmlChar *)0x0) goto LAB_00102b5e;
            pcVar9 = "Section %s\n";
          }
          else {
            pcVar9 = "Suite %s\n";
          }
          printf(pcVar9,pxVar8);
          (*_xmlFree)(pxVar8);
        }
LAB_00102b5e:
        for (cur = getNext(pxVar7,"./testSuite[1]"); cur != (xmlNodePtr)0x0;
            cur = getNext(cur,"following-sibling::testSuite[1]")) {
          xsdTestSuite(cur);
        }
        pxVar7 = getNext(pxVar7,"following-sibling::testSuite[1]");
      } while (pxVar7 != (xmlNodePtr)0x0);
    }
    xmlFreeDoc(lVar6);
  }
  if (nb_leaks == iVar3 && nb_errors == iVar1) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar3));
  }
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar1 = nb_errors;
  lVar6 = xmlReadFile("test/relaxng/testsuite.xml",0,2);
  if (lVar6 == 0) {
    main_cold_7();
  }
  else {
    puts("## Relax NG test suite for libxml2");
    pxVar7 = (xmlNodePtr)xmlDocGetRootElement(lVar6);
    if ((((pxVar7 == (xmlNodePtr)0x0) || (iVar4 = xmlStrEqual(pxVar7->name,"testSuite"), iVar4 == 0)
         ) || (pxVar7 = getNext(pxVar7,"./testSuite[1]"), pxVar7 == (xmlNodePtr)0x0)) ||
       (iVar4 = xmlStrEqual(pxVar7->name,"testSuite"), iVar4 == 0)) {
      main_cold_6();
    }
    else {
      do {
        xsdTestSuite(pxVar7);
        pxVar7 = getNext(pxVar7,"following-sibling::testSuite[1]");
      } while (pxVar7 != (xmlNodePtr)0x0);
    }
    xmlFreeDoc(lVar6);
  }
  if (nb_leaks == iVar3 && nb_errors == iVar1) {
    printf("Ran %d tests, no errors\n",(ulong)(uint)(nb_tests - iVar2));
  }
  else {
    printf("Ran %d tests, %d errors, %d leaks\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)(nb_leaks - iVar3));
  }
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar1 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet","xstc/Tests/Metadata/");
  if (nb_leaks == iVar3 && nb_errors == iVar1) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar2),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar3));
  }
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar1 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if (nb_leaks == iVar3 && nb_errors == iVar1) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar2),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar3));
  }
  iVar3 = nb_leaks;
  iVar2 = nb_tests;
  iVar1 = nb_errors;
  nb_internals = 0;
  nb_schematas = 0;
  xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet","xstc/Tests/");
  if (nb_leaks == iVar3 && nb_errors == iVar1) {
    printf("Ran %d tests (%d schemata), no errors\n",(ulong)(uint)(nb_tests - iVar2),
           (ulong)(uint)nb_schematas);
  }
  else {
    printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
           (ulong)(uint)(nb_tests - iVar2),(ulong)(uint)nb_schematas,
           (ulong)(uint)(nb_errors - iVar1),(ulong)(uint)nb_internals,
           (ulong)(uint)(nb_leaks - iVar3));
  }
  bVar10 = nb_errors != 0 || nb_leaks != 0;
  if (bVar10) {
    printf("Total %d tests, %d errors, %d leaks\n",(ulong)(uint)nb_tests);
  }
  else {
    printf("Total %d tests, no errors\n",(ulong)(uint)nb_tests);
  }
  xmlXPathFreeContext(ctxtXPath);
  xmlCleanupParser();
  xmlMemoryDump();
  if (logfile != (FILE *)0x0) {
    fclose((FILE *)logfile);
  }
  return (uint)bVar10;
}

Assistant:

int
main(int argc ATTRIBUTE_UNUSED, char **argv ATTRIBUTE_UNUSED) {
    int ret = 0;
    int old_errors, old_tests, old_leaks;

    logfile = fopen(LOGFILE, "w");
    if (logfile == NULL) {
        fprintf(stderr,
	        "Could not open the log file, running in verbose mode\n");
	verbose = 1;
    }
    initializeLibxml2();

    if ((argc >= 2) && (!strcmp(argv[1], "-v")))
        verbose = 1;


    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    xsdTest();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest1();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    rngTest2();
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests, no errors\n", nb_tests - old_tests);
    else
	printf("Ran %d tests, %d errors, %d leaks\n",
	       nb_tests - old_tests,
	       nb_errors - old_errors,
	       nb_leaks - old_leaks);
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/NISTXMLSchemaDatatypes.testSet",
		 "xstc/Tests/Metadata/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    else
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/SunXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    else
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);
    old_errors = nb_errors;
    old_tests = nb_tests;
    old_leaks = nb_leaks;
    nb_internals = 0;
    nb_schematas = 0;
    xstcMetadata("xstc/Tests/Metadata/MSXMLSchema1-0-20020116.testSet",
		 "xstc/Tests/");
    if ((nb_errors == old_errors) && (nb_leaks == old_leaks))
	printf("Ran %d tests (%d schemata), no errors\n",
	       nb_tests - old_tests, nb_schematas);
    else
	printf("Ran %d tests (%d schemata), %d errors (%d internals), %d leaks\n",
	       nb_tests - old_tests,
	       nb_schematas,
	       nb_errors - old_errors,
	       nb_internals,
	       nb_leaks - old_leaks);

    if ((nb_errors == 0) && (nb_leaks == 0)) {
        ret = 0;
	printf("Total %d tests, no errors\n",
	       nb_tests);
    } else {
        ret = 1;
	printf("Total %d tests, %d errors, %d leaks\n",
	       nb_tests, nb_errors, nb_leaks);
    }
    xmlXPathFreeContext(ctxtXPath);
    xmlCleanupParser();
    xmlMemoryDump();

    if (logfile != NULL)
        fclose(logfile);
    return(ret);
}